

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testselectionwidget.cpp
# Opt level: O0

int scroll_width_proc(Am_Object *self)

{
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Object local_18;
  Am_Object *local_10;
  Am_Object *self_local;
  
  local_10 = self;
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)self);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)&local_18,0x66);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)local_10,100);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::~Am_Object(&local_18);
  return (iVar1 + -10) - iVar2;
}

Assistant:

Am_Define_Formula(int, scroll_width)
{
  return (int)self.Get_Owner().Get(Am_WIDTH) - 10 - (int)self.Get(Am_LEFT);
}